

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O2

void __thiscall
kj::_::Debug::Context::logMessage
          (Context *this,LogSeverity severity,char *file,int line,int contextDepth,String *text)

{
  ExceptionCallback *pEVar1;
  size_t sVar2;
  undefined4 in_register_0000000c;
  ulong uVar3;
  size_t extraout_RDX;
  undefined4 in_register_00000084;
  char *params_2;
  StringPtr SVar4;
  Value v;
  undefined1 local_85 [45];
  Value local_58;
  
  params_2 = (char *)CONCAT44(in_register_00000084,contextDepth);
  uVar3 = CONCAT44(in_register_0000000c,line);
  if (this->logged == false) {
    local_85._1_4_ = line;
    local_85._5_8_ = file;
    local_85._13_8_ = text;
    ensureInitialized(&local_58,this);
    pEVar1 = (this->super_ExceptionCallback).next;
    sVar2 = strlen(local_58.file);
    SVar4.content.size_ = extraout_RDX;
    SVar4.content.ptr = (char *)(sVar2 + 1);
    SVar4 = trimSourceFilename((kj *)local_58.file,SVar4);
    local_85[0] = 10;
    str<char_const(&)[10],kj::String,char>
              ((String *)(local_85 + 0x15),(kj *)0x209244,(char (*) [10])&local_58.description,
               (String *)local_85,params_2);
    (*pEVar1->_vptr_ExceptionCallback[4])
              (pEVar1,0,SVar4.content.ptr,(ulong)(uint)local_58.line,0,local_85 + 0x15);
    Array<char>::~Array((Array<char> *)(local_85 + 0x15));
    this->logged = true;
    Array<char>::~Array(&local_58.description.content);
    uVar3 = (ulong)(uint)local_85._1_4_;
    file = (char *)local_85._5_8_;
    text = (String *)local_85._13_8_;
  }
  pEVar1 = (this->super_ExceptionCallback).next;
  (*pEVar1->_vptr_ExceptionCallback[4])
            (pEVar1,(ulong)severity,file,uVar3,(ulong)(contextDepth + 1),text);
  return;
}

Assistant:

void Debug::Context::logMessage(LogSeverity severity, const char* file, int line, int contextDepth,
                                String&& text) {
  if (!logged) {
    Value v = ensureInitialized();
    next.logMessage(LogSeverity::INFO, trimSourceFilename(v.file).cStr(), v.line, 0,
                    str("context: ", mv(v.description), '\n'));
    logged = true;
  }

  next.logMessage(severity, file, line, contextDepth + 1, mv(text));
}